

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

parser_error parse_mcat_include_base(parser *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  parser_error pVar4;
  long *plVar5;
  char *name;
  monster_base *pmVar6;
  void *pvVar7;
  ulong uVar8;
  
  plVar5 = (long *)parser_priv(p);
  if (plVar5 == (long *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                  ,0xcac,"enum parser_error parse_mcat_include_base(struct parser *)");
  }
  if (*plVar5 == 0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getstr(p,"name");
    pmVar6 = lookup_monster_base(name);
    if (pmVar6 != (monster_base *)0x0) {
      lVar3 = *plVar5;
      iVar1 = *(int *)(lVar3 + 0x24);
      if (-1 < iVar1) {
        iVar2 = *(int *)(lVar3 + 0x28);
        if (iVar1 <= iVar2) {
          if (iVar1 == iVar2) {
            if (0x7ffffff < iVar2) {
              return PARSE_ERROR_TOO_MANY_ENTRIES;
            }
            uVar8 = 2;
            if (iVar2 != 0) {
              uVar8 = (ulong)(uint)(iVar2 * 2);
            }
            *(int *)(lVar3 + 0x28) = (int)uVar8;
            pvVar7 = mem_realloc(*(void **)(lVar3 + 0x10),uVar8 << 3);
            *(void **)(*plVar5 + 0x10) = pvVar7;
          }
          *(monster_base **)(*(long *)(*plVar5 + 0x10) + (long)*(int *)(*plVar5 + 0x24) * 8) =
               pmVar6;
          *(int *)(*plVar5 + 0x24) = *(int *)(*plVar5 + 0x24) + 1;
          return PARSE_ERROR_NONE;
        }
      }
      __assert_fail("s->categories->n_inc_bases >= 0 && s->categories->n_inc_bases <= s->categories->max_inc_bases"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                    ,0xcb5,"enum parser_error parse_mcat_include_base(struct parser *)");
    }
    pVar4 = PARSE_ERROR_INVALID_MONSTER_BASE;
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_mcat_include_base(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	struct monster_base *b;

	assert(s);
	if (!s->categories) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	b = lookup_monster_base(parser_getstr(p, "name"));
	if (!b) {
		return PARSE_ERROR_INVALID_MONSTER_BASE;
	}
	assert(s->categories->n_inc_bases >= 0
		&& s->categories->n_inc_bases <= s->categories->max_inc_bases);
	if (s->categories->n_inc_bases == s->categories->max_inc_bases) {
		if (s->categories->max_inc_bases > INT_MAX
				/ (2 * (int) sizeof(struct monster_base*))) {
			return PARSE_ERROR_TOO_MANY_ENTRIES;
		}
		s->categories->max_inc_bases = (s->categories->max_inc_bases)
			? 2 * s->categories->max_inc_bases : 2;
		s->categories->inc_bases = mem_realloc(
			s->categories->inc_bases,
			s->categories->max_inc_bases
			* sizeof(struct monster_base*));
	}
	s->categories->inc_bases[s->categories->n_inc_bases] = b;
	++s->categories->n_inc_bases;

	return PARSE_ERROR_NONE;
}